

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_fexdo_df_mips64
               (CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  float64 fVar4;
  long lVar5;
  float16 fVar6;
  float32 fVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_50;
  undefined8 local_48;
  uint32_t local_3c;
  fpr_t *local_38;
  
  local_38 = (env->active_fpu).fpr + ws;
  lVar5 = (ulong)wt * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  local_3c = wd;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = local_38->fs[lVar14];
      fVar6 = float32_to_float16_mips64(fVar7,true,pfVar2);
      *(ushort *)((long)&local_48 + lVar14 * 2) = (ushort)(fVar7 >> 0x10) & 0x8000 | fVar6;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar11 = ieee_ex_to_mips_mips64((uint)bVar3);
      uVar10 = (env->active_tc).msacsr;
      uVar8 = (uVar10 & 0x1000000) >> 0x18 & (uint)(bVar3 >> 6);
      uVar13 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar13 = uVar8;
      }
      if (-1 < (char)bVar3) {
        uVar13 = uVar8;
      }
      uVar13 = uVar13 | uVar11;
      uVar12 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar11 >> 2);
      uVar8 = uVar12 | uVar13;
      uVar11 = uVar11 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar13 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar11 = uVar8;
      }
      if ((uVar13 & 2) == 0) {
        uVar11 = uVar8;
      }
      if ((uVar11 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar11 << 0xc;
LAB_008cdb9a:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar13 = uVar11 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_008cdb9a;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar11) != 0) {
        fVar6 = float16_default_nan_mips64(pfVar2);
        *(float16 *)((long)&local_48 + lVar14 * 2) = fVar6 & 0xffc0 ^ 0x200 | (ushort)uVar11;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = *(float32 *)((long)(env->active_fpu).fpr + lVar14 * 4 + lVar5 + -0x338);
      fVar6 = float32_to_float16_mips64(fVar7,true,pfVar2);
      *(ushort *)((long)&local_50 + lVar14 * 2) = (ushort)(fVar7 >> 0x10) & 0x8000 | fVar6;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar11 = ieee_ex_to_mips_mips64((uint)bVar3);
      uVar10 = (env->active_tc).msacsr;
      uVar8 = (uVar10 & 0x1000000) >> 0x18 & (uint)(bVar3 >> 6);
      uVar13 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar13 = uVar8;
      }
      if (-1 < (char)bVar3) {
        uVar13 = uVar8;
      }
      uVar13 = uVar13 | uVar11;
      uVar8 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar11 >> 2);
      uVar12 = uVar8 | uVar13;
      uVar11 = uVar11 & 0xfffffffc;
      if ((uVar8 != 0 || (uVar13 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar11 = uVar12;
      }
      if ((uVar13 & 2) == 0) {
        uVar11 = uVar12;
      }
      if ((uVar11 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar13 = uVar11 << 0xc;
LAB_008cdcab:
        (env->active_tc).msacsr = uVar13 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar13 = uVar11 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_008cdcab;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar11) != 0) {
        fVar6 = float16_default_nan_mips64(pfVar2);
        *(float16 *)((long)&local_50 + lVar14 * 2) = fVar6 & 0xffc0 ^ 0x200 | (ushort)uVar11;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x19bc,
                    "void helper_msa_fexdo_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar14 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar4 = *(float64 *)((long)local_38 + lVar14 * 8);
      fVar7 = float64_to_float32_mips64(fVar4,pfVar2);
      uVar10 = fVar7 | 0x80000000;
      if (-1 < (long)fVar4) {
        uVar10 = fVar7;
      }
      *(uint *)((long)&local_48 + lVar14 * 4) = uVar10;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((uVar10 & 0x7f800000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((uVar10 & 0x7fffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar8 = ieee_ex_to_mips_mips64(uVar13);
      uVar10 = (env->active_tc).msacsr;
      uVar12 = (uVar10 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 | uVar8;
      uVar12 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar9 = uVar12 | uVar11;
      uVar13 = uVar8 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar13 = uVar9;
      }
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar9;
      }
      if ((uVar13 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar13 << 0xc;
LAB_008cd941:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar11 = uVar13 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_008cd941;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) != 0) {
        fVar7 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)&local_48 + lVar14 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar13;
      }
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar4 = *(float64 *)((long)(env->active_fpu).fpr + lVar14 * 8 + lVar5 + -0x338);
      fVar7 = float64_to_float32_mips64(fVar4,pfVar2);
      uVar10 = fVar7 | 0x80000000;
      if (-1 < (long)fVar4) {
        uVar10 = fVar7;
      }
      *(uint *)((long)&local_50 + lVar14 * 4) = uVar10;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar13 = (uint)bVar3;
      if ((uVar10 & 0x7f800000) == 0) {
        uVar13 = uVar13 | 0x10;
      }
      if ((uVar10 & 0x7fffffff) == 0) {
        uVar13 = (uint)bVar3;
      }
      uVar8 = ieee_ex_to_mips_mips64(uVar13);
      uVar10 = (env->active_tc).msacsr;
      uVar12 = (uVar10 & 0x1000000) >> 0x18 & uVar13 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar12;
      }
      if (uVar13 < 0x80) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 | uVar8;
      uVar12 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar8 >> 2);
      uVar9 = uVar12 | uVar11;
      uVar13 = uVar8 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar13 = uVar9;
      }
      if ((uVar11 & 2) == 0) {
        uVar13 = uVar9;
      }
      if ((uVar13 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar13 << 0xc;
LAB_008cda6a:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar11 = uVar13 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_008cda6a;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar13) != 0) {
        fVar7 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)&local_50 + lVar14 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar13;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
  }
  uVar10 = (env->active_tc).msacsr;
  uVar13 = uVar10 >> 7 & 0x1f | 0x20;
  if ((uVar13 & uVar10 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar13);
  }
  (env->active_tc).msacsr = (uVar10 >> 0xc & 0x1f) << 2 | uVar10;
  (env->active_fpu).fpr[local_3c].fd = local_50;
  *(undefined8 *)((long)(env->active_fpu).fpr + (ulong)local_3c * 0x10 + 8) = local_48;
  return;
}

Assistant:

void helper_msa_fexdo_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                         uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            /*
             * Half precision floats come in two formats: standard
             * IEEE and "ARM" format.  The latter gains extra exponent
             * range by omitting the NaN/Inf encodings.
             */
            flag ieee = 1;

            MSA_FLOAT_BINOP(Lh(pwx, i), from_float32, pws->w[i], ieee, 16);
            MSA_FLOAT_BINOP(Rh(pwx, i), from_float32, pwt->w[i], ieee, 16);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(Lw(pwx, i), from_float64, pws->d[i], 32);
            MSA_FLOAT_UNOP(Rw(pwx, i), from_float64, pwt->d[i], 32);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());
    msa_move_v(pwd, pwx);
}